

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope_eval.cxx
# Opt level: O0

float bez2_time(float x0,float x1,float x2,float x3,float time,float *t0,float *t1)

{
  float *pfVar1;
  float fVar2;
  float extraout_XMM0_Da;
  float v;
  float t;
  float *t1_local;
  float *t0_local;
  float time_local;
  float x3_local;
  float x2_local;
  float x1_local;
  float x0_local;
  
  x1_local = (*t1 - *t0) * 0.5 + *t0;
  pfVar1 = t0;
  fVar2 = bezier(x0,x1,x2,x3,x1_local);
  std::abs((int)pfVar1);
  if (0.0001 < extraout_XMM0_Da) {
    if (fVar2 <= time) {
      *t0 = x1_local;
    }
    else {
      *t1 = x1_local;
    }
    x1_local = bez2_time(x0,x1,x2,x3,time,t0,t1);
  }
  return x1_local;
}

Assistant:

static float bez2_time(float x0, float x1, float x2, float x3, float time,
		float* t0, float* t1)
{
	float t = *t0 + (*t1 - *t0)*0.5f;
	float v = bezier(x0, x1, x2, x3, t);
	if (std::abs(time - v) > 1e-4f) {
		if (v > time)
			*t1 = t;
		else
			*t0 = t;
		return bez2_time(x0, x1, x2, x3, time, t0, t1);
	} else {
		return t;
	}
}